

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::make(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  Type type_00;
  Expression *pEVar6;
  Fatal *this_01;
  undefined1 local_1b0 [399];
  char local_21;
  
  type_00 = getSubType(this,type);
  if (this->trivialNesting == 0) {
    this_00 = &this->random;
    if ((this->random).finishedInput == false) {
      iVar5 = this->nesting;
      iVar2 = (this->fuzzParams->super_FuzzParams).NESTING_LIMIT;
      if (SBORROW4(iVar5,iVar2 * 5) != iVar5 + iVar2 * -5 < 0) {
        if (iVar5 < iVar2) {
LAB_0015d94c:
          this->nesting = iVar5 + 1;
          if (type_00.id < 2) {
            if (type_00.id == 0) {
              pEVar6 = _makenone(this);
            }
            else {
              pEVar6 = _makeunreachable(this);
            }
          }
          else {
            pEVar6 = _makeConcrete(this,type_00);
          }
          cVar4 = ::wasm::Type::isSubType((Type)(pEVar6->type).id,type_00);
          if (cVar4 != '\0') {
            this->nesting = this->nesting + -1;
            return pEVar6;
          }
          Fatal::Fatal((Fatal *)local_1b0);
          poVar1 = (ostream *)(local_1b0 + 0x10);
          std::operator<<(poVar1,"Did not generate the right subtype of ");
          ::wasm::operator<<(poVar1,type_00);
          std::operator<<(poVar1,", instead we have ");
          this_01 = Fatal::operator<<((Fatal *)local_1b0,&pEVar6->type);
          std::operator<<((ostream *)&this_01->field_0x10," : ");
          std::operator<<((ostream *)&this_01->field_0x10,pEVar6);
          local_21 = '\n';
          Fatal::operator<<(this_01,&local_21);
          Fatal::~Fatal((Fatal *)local_1b0);
        }
        bVar3 = Random::oneIn(this_00,3);
        if (bVar3) {
          iVar5 = this->nesting;
          goto LAB_0015d94c;
        }
      }
    }
    if (1 < type_00.id) {
      bVar3 = Random::oneIn(this_00,2);
      if (bVar3) {
        pEVar6 = makeConst(this,type_00);
        return pEVar6;
      }
      pEVar6 = makeLocalGet(this,type_00);
      return pEVar6;
    }
    if (type_00.id == 0) {
      bVar3 = Random::oneIn(this_00,2);
      if (bVar3) {
        pEVar6 = makeNop(this,(Type)0x0);
        return pEVar6;
      }
      pEVar6 = makeLocalSet(this,(Type)0x0);
      return pEVar6;
    }
  }
  pEVar6 = makeTrivial(this,type_00);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::make(Type type) {
  type = getSubType(type);
  if (trivialNesting) {
    // We are nested under a makeTrivial call, so only emit something trivial.
    return makeTrivial(type);
  }
  // When we should stop, emit something small (but not necessarily trivial).
  if (random.finished() ||
      nesting >= 5 * fuzzParams->NESTING_LIMIT || // hard limit
      (nesting >= fuzzParams->NESTING_LIMIT && !oneIn(3))) {
    if (type.isConcrete()) {
      if (oneIn(2)) {
        return makeConst(type);
      } else {
        return makeLocalGet(type);
      }
    } else if (type == Type::none) {
      if (oneIn(2)) {
        return makeNop(type);
      } else {
        return makeLocalSet(type);
      }
    }
    assert(type == Type::unreachable);
    return makeTrivial(type);
  }
  nesting++;
  Expression* ret = nullptr;
  if (type.isConcrete()) {
    ret = _makeConcrete(type);
  } else if (type == Type::none) {
    ret = _makenone();
  } else {
    assert(type == Type::unreachable);
    ret = _makeunreachable();
  }
  if (!Type::isSubType(ret->type, type)) {
    Fatal() << "Did not generate the right subtype of " << type
            << ", instead we have " << ret->type << " : " << *ret << '\n';
  }
  nesting--;
  return ret;
}